

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicseffect.cpp
# Opt level: O0

void __thiscall QGraphicsOpacityEffect::draw(QGraphicsOpacityEffect *this,QPainter *painter)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  QGraphicsOpacityEffectPrivate *pQVar4;
  ulong uVar5;
  void *__src;
  QGraphicsEffect *in_RSI;
  QPoint *in_RDI;
  long in_FS_OFFSET;
  CoordinateSystem system;
  QGraphicsOpacityEffectPrivate *d;
  QPainter pixmapPainter;
  QPixmap pixmap;
  QPoint offset;
  QTransform worldTransform;
  QPainter *in_stack_fffffffffffffe68;
  QPoint *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe80;
  PixmapPadMode in_stack_fffffffffffffe84;
  undefined4 in_stack_fffffffffffffe88;
  undefined1 local_158 [16];
  QPoint local_148;
  QBrush local_140 [32];
  undefined1 *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  undefined1 local_f8 [80];
  undefined1 local_a8 [80];
  QTransform local_58;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QGraphicsOpacityEffect *)0x4a5625);
  if ((pQVar4->field_0xb8 & 1) == 0) {
    if ((((byte)pQVar4->field_0xb8 >> 1 & 1) == 0) || (((byte)pQVar4->field_0xb8 >> 2 & 1) != 0)) {
      local_100 = &DAT_aaaaaaaaaaaaaaaa;
      QPoint::QPoint(in_stack_fffffffffffffe70);
      bVar1 = QGraphicsEffect::sourceIsPixmap((QGraphicsEffect *)in_stack_fffffffffffffe70);
      uVar2 = (uint)bVar1;
      local_118 = &DAT_aaaaaaaaaaaaaaaa;
      local_110 = &DAT_aaaaaaaaaaaaaaaa;
      local_108 = &DAT_aaaaaaaaaaaaaaaa;
      QGraphicsEffect::sourcePixmap
                (in_RSI,(CoordinateSystem)((ulong)pQVar4 >> 0x20),
                 (QPoint *)(ulong)CONCAT14(bVar1,in_stack_fffffffffffffe88),
                 in_stack_fffffffffffffe84);
      uVar5 = QPixmap::isNull();
      if ((uVar5 & 1) == 0) {
        QPainter::save();
        QPainter::setOpacity(pQVar4->opacity);
        if (((byte)pQVar4->field_0xb8 >> 2 & 1) != 0) {
          local_120 = &DAT_aaaaaaaaaaaaaaaa;
          QPainter::QPainter((QPainter *)&local_120,(QPaintDevice *)&local_118);
          in_stack_fffffffffffffe84 = QPainter::renderHints();
          QPainter::setRenderHints
                    ((QFlags_conflict1 *)&local_120,SUB41(in_stack_fffffffffffffe84,0));
          QPainter::setCompositionMode((CompositionMode)&local_120);
          if (uVar2 == 0) {
            memcpy(&local_58,&DAT_00b0d7e0,0x50);
            __src = (void *)QPainter::worldTransform();
            memcpy(&local_58,__src,0x50);
            iVar3 = QPoint::x((QPoint *)0x4a5809);
            in_stack_fffffffffffffe70 = (QPoint *)(double)-iVar3;
            iVar3 = QPoint::y((QPoint *)0x4a5826);
            QTransform::fromTranslate((double)in_stack_fffffffffffffe70,(double)-iVar3);
            QTransform::operator*=(&local_58,(QTransform *)local_a8);
            QPainter::setWorldTransform((QTransform *)&local_120,SUB81(&local_58,0));
            QGraphicsEffect::sourceBoundingRect
                      ((QGraphicsEffect *)
                       CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                       (CoordinateSystem)((ulong)in_RDI >> 0x20));
            QPainter::fillRect((QRectF *)&local_120,local_140);
          }
          else {
            local_148 = ::operator-(in_stack_fffffffffffffe70);
            QPainter::translate((QPainter *)
                                CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),in_RDI
                               );
            local_158 = QPixmap::rect();
            QPainter::fillRect((QRect *)&local_120,(QBrush *)local_158);
          }
          QPainter::~QPainter((QPainter *)&local_120);
        }
        if (uVar2 == 0) {
          QTransform::QTransform((QTransform *)in_stack_fffffffffffffe70);
          QPainter::setWorldTransform((QTransform *)in_RSI,SUB81(local_f8,0));
        }
        QPainter::drawPixmap
                  ((QPainter *)CONCAT44(uVar2,in_stack_fffffffffffffe88),
                   (QPoint *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                   (QPixmap *)in_RDI);
        QPainter::restore();
      }
      QPixmap::~QPixmap((QPixmap *)&local_118);
    }
    else {
      QGraphicsEffect::drawSource
                ((QGraphicsEffect *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsOpacityEffect::draw(QPainter *painter)
{
    Q_D(QGraphicsOpacityEffect);

    // Transparent; nothing to draw.
    if (d->isFullyTransparent)
        return;

    // Opaque; draw directly without going through a pixmap.
    if (d->isFullyOpaque && !d->hasOpacityMask) {
        drawSource(painter);
        return;
    }

    QPoint offset;
    Qt::CoordinateSystem system = sourceIsPixmap() ? Qt::LogicalCoordinates : Qt::DeviceCoordinates;
    QPixmap pixmap = sourcePixmap(system, &offset, QGraphicsEffect::NoPad);
    if (pixmap.isNull())
        return;

    painter->save();
    painter->setOpacity(d->opacity);

    if (d->hasOpacityMask) {
        QPainter pixmapPainter(&pixmap);
        pixmapPainter.setRenderHints(painter->renderHints());
        pixmapPainter.setCompositionMode(QPainter::CompositionMode_DestinationIn);
        if (system == Qt::DeviceCoordinates) {
            QTransform worldTransform = painter->worldTransform();
            worldTransform *= QTransform::fromTranslate(-offset.x(), -offset.y());
            pixmapPainter.setWorldTransform(worldTransform);
            pixmapPainter.fillRect(sourceBoundingRect(), d->opacityMask);
        } else {
            pixmapPainter.translate(-offset);
            pixmapPainter.fillRect(pixmap.rect(), d->opacityMask);
        }
    }

    if (system == Qt::DeviceCoordinates)
        painter->setWorldTransform(QTransform());

    painter->drawPixmap(offset, pixmap);
    painter->restore();
}